

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O0

void __thiscall Market::match(Market *this,Order *bid,Order *ask)

{
  long lVar1;
  long lVar2;
  double price_00;
  undefined8 local_30;
  long quantity;
  double price;
  Order *ask_local;
  Order *bid_local;
  Market *this_local;
  
  price_00 = Order::getPrice(ask);
  lVar1 = Order::getOpenQuantity(bid);
  lVar2 = Order::getOpenQuantity(ask);
  if (lVar2 < lVar1) {
    local_30 = Order::getOpenQuantity(ask);
  }
  else {
    local_30 = Order::getOpenQuantity(bid);
  }
  Order::execute(bid,price_00,local_30);
  Order::execute(ask,price_00,local_30);
  return;
}

Assistant:

void Market::match(Order &bid, Order &ask) {
  double price = ask.getPrice();
  long quantity = 0;

  if (bid.getOpenQuantity() > ask.getOpenQuantity()) {
    quantity = ask.getOpenQuantity();
  } else {
    quantity = bid.getOpenQuantity();
  }

  bid.execute(price, quantity);
  ask.execute(price, quantity);
}